

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_font_bake_custom_data
               (void *img_memory,int img_width,int img_height,nk_recti img_dst,
               char *texture_data_mask,int tex_width,int tex_height,char white,char black)

{
  undefined1 uVar1;
  int iVar2;
  int off1;
  int off0;
  int n;
  int x;
  int y;
  nk_byte *pixels;
  int tex_width_local;
  char *texture_data_mask_local;
  int img_height_local;
  int img_width_local;
  void *img_memory_local;
  nk_recti img_dst_local;
  
  if ((((img_memory != (void *)0x0) && (img_width != 0)) && (img_height != 0)) &&
     (texture_data_mask != (char *)0x0)) {
    n = 0;
    for (y = 0; y < tex_height; y = y + 1) {
      for (x = 0; x < tex_width; x = x + 1) {
        img_dst_local.x = img_dst.x;
        img_dst_local.y = img_dst.y;
        iVar2 = img_dst_local.x + x + (img_dst_local.y + y) * img_width;
        uVar1 = 0;
        if (texture_data_mask[n] == white) {
          uVar1 = 0xff;
        }
        *(undefined1 *)((long)img_memory + (long)iVar2) = uVar1;
        uVar1 = 0;
        if (texture_data_mask[n] == black) {
          uVar1 = 0xff;
        }
        *(undefined1 *)((long)img_memory + (long)(iVar2 + 1 + tex_width)) = uVar1;
        n = n + 1;
      }
    }
  }
  return;
}

Assistant:

NK_INTERN void
nk_font_bake_custom_data(void *img_memory, int img_width, int img_height,
struct nk_recti img_dst, const char *texture_data_mask, int tex_width,
int tex_height, char white, char black)
{
nk_byte *pixels;
int y = 0;
int x = 0;
int n = 0;

NK_ASSERT(img_memory);
NK_ASSERT(img_width);
NK_ASSERT(img_height);
NK_ASSERT(texture_data_mask);
NK_UNUSED(tex_height);
if (!img_memory || !img_width || !img_height || !texture_data_mask)
return;

pixels = (nk_byte*)img_memory;
for (y = 0, n = 0; y < tex_height; ++y) {
for (x = 0; x < tex_width; ++x, ++n) {
const int off0 = ((img_dst.x + x) + (img_dst.y + y) * img_width);
const int off1 = off0 + 1 + tex_width;
pixels[off0] = (texture_data_mask[n] == white) ? 0xFF : 0x00;
pixels[off1] = (texture_data_mask[n] == black) ? 0xFF : 0x00;
}
}
}